

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6.cpp
# Opt level: O3

void __thiscall Nes_Vrc6::run_until(Nes_Vrc6 *this,cpu_time_t time)

{
  if (this->last_time <= time) {
    run_square(this,this->oscs,time);
    run_square(this,this->oscs + 1,time);
    run_saw(this,time);
    this->last_time = time;
    return;
  }
  __assert_fail("( \"unmet requirement\", time >= last_time )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Vrc6.cpp"
                ,0x42,"void Nes_Vrc6::run_until(cpu_time_t)");
}

Assistant:

void Nes_Vrc6::run_until( cpu_time_t time )
{
	require( time >= last_time );
	run_square( oscs [0], time );
	run_square( oscs [1], time );
	run_saw( time );
	last_time = time;
}